

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_param_bytes(CmdlineParser *this,string *name,uint64_t *dest,string *desc)

{
  ArgumentBytes64 *this_00;
  allocator local_59;
  string local_58;
  ArgumentBytes64 *local_38;
  
  this_00 = (ArgumentBytes64 *)operator_new(0x80);
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  ArgumentBytes64::ArgumentBytes64(this_00,'\0',name,&local_58,desc,true,dest);
  local_38 = this_00;
  std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>::
  emplace_back<tlx::CmdlineParser::ArgumentBytes64*>
            ((vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>> *)
             &this->param_list_,&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  calc_param_max(this,(this->param_list_).
                      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]);
  return;
}

Assistant:

void CmdlineParser::add_param_bytes(
    const std::string& name, uint64_t& dest, const std::string& desc) {
    param_list_.emplace_back(
        new ArgumentBytes64(0, name, "", desc, true, dest));
    calc_param_max(param_list_.back());
}